

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void process_args(wchar_t argc,char **argv)

{
  byte bVar1;
  __gid_t _Var2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  nh_roles_info *ri;
  char **ppcVar6;
  char *__s1;
  
  ri = (nh_roles_info *)nh_get_roles();
  if (L'\x01' < argc) {
    do {
      __s1 = argv[1];
      if (*__s1 != '-') {
        return;
      }
      ppcVar6 = argv + 1;
      wVar4 = argc + L'\xffffffff';
      bVar1 = __s1[1];
      if (bVar1 < 0x56) {
        if (bVar1 < 0x48) {
          if (bVar1 == 0x40) {
            random_player = '\x01';
          }
          else {
            if (bVar1 != 0x44) {
              if (bVar1 == 0x2d) {
                iVar3 = strcmp(__s1,"--help");
                if (iVar3 == 0) {
                  puts("Usage: dynamohack [OPTIONS]");
                  putchar(10);
                  puts("--help      show this help and exit");
                  puts("--version   show version number and exit");
                  puts("-D          start games in wizard mode");
                  puts("-X          start games in explore mode");
                  puts("-u name     specify player name");
                  puts("-p role     specify role");
                  puts("-r race     specify race");
                  puts("-@          specify a random character");
                  puts("-H dir      override the data directory");
                  puts("-V dir      override the variable data \"playground\" directory");
                  puts("-U dir      override the user directory");
                  goto LAB_001081c8;
                }
                goto LAB_0010819e;
              }
              goto LAB_001080a8;
            }
            ui_flags.playmode = 3;
          }
        }
        else if (bVar1 == 0x48) {
          _Var2 = getgid();
          iVar3 = setregid(0xffffffff,_Var2);
          if (iVar3 == -1) goto LAB_00108199;
          if ((*ppcVar6)[2] == '\0') {
            if (argc == L'\x02') goto LAB_001081de;
            override_hackdir = argv[2];
            goto LAB_0010809b;
          }
          override_hackdir = *ppcVar6 + 2;
        }
        else {
          if (bVar1 != 0x55) goto LAB_001080a8;
          _Var2 = getgid();
          iVar3 = setregid(0xffffffff,_Var2);
          if (iVar3 == -1) goto LAB_00108194;
          if ((*ppcVar6)[2] == '\0') {
            if (argc == L'\x02') goto LAB_001081d9;
            override_userdir = argv[2];
            goto LAB_0010809b;
          }
          override_userdir = *ppcVar6 + 2;
        }
      }
      else if (bVar1 < 0x70) {
        if (bVar1 == 0x56) {
          _Var2 = getgid();
          iVar3 = setregid(0xffffffff,_Var2);
          if (iVar3 == -1) {
            process_args_cold_4();
LAB_00108194:
            process_args_cold_2();
LAB_00108199:
            process_args_cold_6();
LAB_0010819e:
            iVar3 = strcmp(__s1,"--version");
            if (iVar3 == 0) {
              printf("DynaMoHack version %d.%d.%d\n",0,0,1);
LAB_001081c8:
              exit(0);
            }
LAB_001081e3:
            process_args_cold_8();
            signal(1,sighup_handler);
            signal(0xf,sighup_handler);
            signal(0x18,sighup_handler);
            signal(3,(__sighandler_t)0x1);
            signal(2,sigint_handler);
            return;
          }
          if ((*ppcVar6)[2] == '\0') {
            if (argc == L'\x02') {
LAB_001081d4:
              process_args_cold_3();
LAB_001081d9:
              process_args_cold_1();
LAB_001081de:
              process_args_cold_5();
              goto LAB_001081e3;
            }
            override_vardir = argv[2];
            goto LAB_0010809b;
          }
          override_vardir = *ppcVar6 + 2;
        }
        else {
          if (bVar1 != 0x58) goto LAB_001080a8;
          ui_flags.playmode = 2;
        }
      }
      else if (bVar1 == 0x70) {
        if (__s1[2] == '\0') {
          wVar4 = L'\x01';
          if (argc != L'\x02') {
            wVar4 = str2role(ri,argv[2]);
            if (L'\xffffffff' < wVar4) {
              initrole = wVar4;
            }
            goto LAB_0010809b;
          }
        }
        else {
          __s1 = __s1 + 2;
LAB_001080a8:
          wVar5 = str2role(ri,__s1);
          if (L'\xffffffff' < wVar5) {
            initrole = wVar5;
          }
        }
      }
      else if (bVar1 == 0x72) {
        if (__s1[2] == '\0') {
          wVar4 = L'\x01';
          if (argc != L'\x02') {
            wVar4 = str2race(ri,argv[2]);
            if (L'\xffffffff' < wVar4) {
              initrace = wVar4;
            }
            goto LAB_0010809b;
          }
        }
        else {
          wVar5 = str2race(ri,__s1 + 2);
          if (L'\xffffffff' < wVar5) {
            initrace = wVar5;
          }
        }
      }
      else {
        if (bVar1 != 0x75) goto LAB_001080a8;
        if (__s1[2] == '\0') {
          if (argc == L'\x02') {
            process_args_cold_7();
            goto LAB_001081d4;
          }
          strncpy(settings.plname,argv[2],0xff);
LAB_0010809b:
          ppcVar6 = argv + 2;
          wVar4 = argc + L'\xfffffffe';
        }
        else {
          strncpy(settings.plname,__s1 + 2,0xff);
        }
      }
      argc = wVar4;
      argv = ppcVar6;
    } while (L'\x01' < argc);
  }
  return;
}

Assistant:

static void process_args(int argc, char *argv[])
{
    int i;
    const struct nh_roles_info *ri = nh_get_roles();

    /*
     * Process options.
     */
    while (argc > 1 && argv[1][0] == '-') {
	argv++;
	argc--;
	switch (argv[0][1]) {
	case '-':
	    if (!strcmp(argv[0], "--help")) {
		puts("Usage: dynamohack [OPTIONS]");
		puts("");
		puts("--help      show this help and exit");
		puts("--version   show version number and exit");
		puts("-D          start games in wizard mode");
		puts("-X          start games in explore mode");
		puts("-u name     specify player name");
		puts("-p role     specify role");
		puts("-r race     specify race");
		puts("-@          specify a random character");
		puts("-H dir      override the data directory");
		puts("-V dir      override the variable data \"playground\" directory");
		puts("-U dir      override the user directory");
		exit(0);
	    } else if (!strcmp(argv[0], "--version")) {
		printf("DynaMoHack version %d.%d.%d\n",
		       VERSION_MAJOR, VERSION_MINOR, PATCHLEVEL);
		exit(0);
	    } else {
		fprintf(stderr, "Unrecognized option '%s'\n", argv[0]);
		exit(1);
	    }
	    break;

	case 'D':
	    ui_flags.playmode = MODE_WIZARD;
	    break;

	case 'X':
	    ui_flags.playmode = MODE_EXPLORE;
	    break;

	case 'u':
	    if (argv[0][2]) {
		/* -uname */
		strncpy(settings.plname, argv[0]+2, sizeof(settings.plname)-1);
	    } else if (argc > 1) {
		/* -u name */
		argc--;
		argv++;
		strncpy(settings.plname, argv[0], sizeof(settings.plname)-1);
	    } else {
		fputs("Player name expected after -u\n", stderr);
		exit(1);
	    }
	    break;

	case 'p': /* profession (role) */
	    if (argv[0][2]) {
		i = str2role(ri, &argv[0][2]);
		if (i >= 0)
		    initrole = i;
	    } else if (argc > 1) {
		argc--;
		argv++;
		i = str2role(ri, argv[0]);
		if (i >= 0)
		    initrole = i;
	    }
	    break;

	case 'r': /* race */
	    if (argv[0][2]) {
		i = str2race(ri, &argv[0][2]);
		if (i >= 0)
		    initrace = i;
	    } else if (argc > 1) {
		argc--;
		argv++;
		i = str2race(ri, argv[0]);
		if (i >= 0)
		    initrace = i;
	    }
	    break;

	case '@':
	    random_player = TRUE;
	    break;

	case 'H':
#ifdef UNIX
	    if (setregid(-1, getgid()) == -1) {
		perror("Error processing -H");
		exit(14);
	    }
#endif
	    if (argv[0][2]) {
		/* -Hdir */
		override_hackdir = argv[0] + 2;
	    } else if (argc > 1) {
		/* -H dir */
		argv++;
		argc--;
		override_hackdir = argv[0];
	    } else {
		fputs("data directory expected after -H\n", stderr);
		exit(1);
	    }
	    break;

	case 'V':
#ifdef UNIX
	    if (setregid(-1, getgid()) == -1) {
		perror("Error processing -V");
		exit(14);
	    }
#endif
	    if (argv[0][2]) {
		/* -Vdir */
		override_vardir = argv[0] + 2;
	    } else if (argc > 1) {
		/* -V dir */
		argv++;
		argc--;
		override_vardir = argv[0];
	    } else {
		fputs("variable data directory expected after -V\n", stderr);
		exit(1);
	    }
	    break;

	case 'U':
#ifdef UNIX
	    if (setregid(-1, getgid()) == -1) {
		perror("Error processing -U");
		exit(14);
	    }
#endif
	    if (argv[0][2]) {
		/* -Udir */
		override_userdir = argv[0] + 2;
	    } else if (argc > 1) {
		/* -U dir */
		argv++;
		argc--;
		override_userdir = argv[0];
	    } else {
		fputs("user directory expected after -U\n", stderr);
		exit(1);
	    }
	    break;

	default:
	    i = str2role(ri, argv[0]);
	    if (i >= 0)
		initrole = i;
	}
    }
}